

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

bool __thiscall ON_DimStyle::UnitSystemIsSet(ON_DimStyle *this)

{
  LengthUnitSystem LVar1;
  LengthUnitSystem LVar2;
  
  LVar1 = this->m_dimstyle_unitsystem;
  LVar2 = None;
  if ((LVar1 != CustomUnits) && (LVar1 != Unset)) {
    LVar2 = LVar1;
  }
  return LVar2 != CustomUnits && LVar2 != None;
}

Assistant:

ON::LengthUnitSystem ON_DimStyle::UnitSystem() const
{
  /// NOTE WELL: A dimstyle unit system was added in V6, but has never been fully used.
  /// The idea was this would make it easier to figure out what text height/ arrow size, 
  /// ... actually meant. Especially in situations where model space and page space have
  /// different unit systems, and in more complex cases like text in instance definitions
  /// and inserting annotation from models with mismatched unit systems.
  /// It is used internally to get some scales properly set and use in limited
  /// merging contexts.
  ///   
  /// From a user's perspective, in Rhino 6 and Rhino 7 ON_DimStyle lengths like TextHeight(), ArrowSize(), ... 
  /// are with respect to the context the annotation resides in. For example, if TextHeight() = 3.5,
  /// model units = meters, page units = millimters, and DimScale() = 1, then 
  /// text created in model space will be 3.5 meters high and
  /// text created in page space will be 3.5 millimeters high.
  /// 
  /// Ideally, ON_DimStyle::UnitSystem() would specify the text height units 
  /// and ON_DimStyle::DimScale() could be adjusted as model space extents require.
  /// Text in instance definitions would have a well defined height and references
  /// to those instance definitions would display predictably in both model space and page space.

  // It is critical that this function never return Unset or CustomUnits.
  // returning None insures unknown scal values are 1 instead of ON_DBL_QNAN
  if (ON::LengthUnitSystem::Unset == m_dimstyle_unitsystem || ON::LengthUnitSystem::CustomUnits == m_dimstyle_unitsystem)
    return ON::LengthUnitSystem::None;

  return m_dimstyle_unitsystem;
}